

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O1

void __thiscall
OpenMD::SimpleTypeData<OpenMD::FuncflParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::FuncflParameters> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pdVar2;
  pointer pcVar3;
  
  (this->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__SimpleTypeData_003000b8;
  pdVar2 = (this->data_).F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->data_).F.super__Vector_base<double,_std::allocator<double>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  pdVar2 = (this->data_).rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->data_).rho.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  pdVar2 = (this->data_).Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->data_).Z.super__Vector_base<double,_std::allocator<double>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  (this->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__GenericData_002fba50;
  pcVar3 = (this->super_GenericData).id_._M_dataplus._M_p;
  paVar1 = &(this->super_GenericData).id_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0xa8);
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}